

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O2

unsigned_long
pstore::sparse_array<int,unsigned_long>::bitmap<std::_Rb_tree_const_iterator<unsigned_long>,void>
          (_Rb_tree_const_iterator<unsigned_long> first,_Rb_tree_const_iterator<unsigned_long> last)

{
  unsigned_long uVar1;
  
  uVar1 = std::
          accumulate<std::_Rb_tree_const_iterator<unsigned_long>,unsigned_long,pstore::sparse_array<int,unsigned_long>::bitmap<std::_Rb_tree_const_iterator<unsigned_long>,void>(std::_Rb_tree_const_iterator<unsigned_long>,std::_Rb_tree_const_iterator<unsigned_long>)::_lambda(unsigned_long,unsigned_long)_1_>
                    (first._M_node,last._M_node,0);
  return uVar1;
}

Assistant:

BitmapType sparse_array<ValueType, BitmapType>::bitmap (InputIterator first,
                                                            InputIterator last) {
        return std::accumulate (
            first, last, BitmapType{0U},
            [] (BitmapType const mm, typename std::iterator_traits<InputIterator>::value_type const idx) {
                PSTORE_ASSERT (idx < max_size ());
                auto const mask = BitmapType{1U} << idx;
                PSTORE_ASSERT ((mm & mask) == 0U &&
                               "The same index must not appear more than once in the "
                               "collection of sparse indices");
                return static_cast<BitmapType> (mm | mask);
            });
    }